

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

w_status wp_token_scan_hexadecimal_flt(w_tokenizer *tokenizer,w_token_id *id)

{
  byte bVar1;
  w_status wVar2;
  char *pcVar3;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1e6);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1e7);
  }
  pcVar3 = tokenizer->token_begin;
  if (*pcVar3 != '0') {
    w_handle_failed_assertion
              ("tokenizer->token_begin[0] == \'0\'","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1e8);
    pcVar3 = tokenizer->token_begin;
  }
  if (pcVar3[1] != 'x') {
    w_handle_failed_assertion
              ("tokenizer->token_begin[1] == \'x\'","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1e9);
  }
  if (tokenizer->it[-1] != '.') {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'.\'","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1ea);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_hexadecimal_flt",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x1eb);
  }
  wp_token_consume_hexadecimal_digits(tokenizer);
  bVar1 = *tokenizer->it;
  if (((ulong)bVar1 < 0x30) && ((0xac0100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
    *id = W_TOKEN_ID_FLT_HEXADECIMAL;
    return W_SUCCESS;
  }
  if (bVar1 == 0x70) {
    tokenizer->it = tokenizer->it + 1;
    tokenizer->column = tokenizer->column + 1;
    wVar2 = wp_token_scan_flt_exponent(tokenizer,id,W_TOKEN_ID_FLT_HEXADECIMAL);
    return wVar2;
  }
  wVar2 = wp_token_add_error(tokenizer,"not a valid hexadecimal floating-point literal character");
  return wVar2;
}

Assistant:

static enum w_status
wp_token_scan_hexadecimal_flt(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->token_begin[0] == '0');
    W_ASSERT(tokenizer->token_begin[1] == 'x');
    W_ASSERT(tokenizer->it[-1] == '.');
    W_ASSERT(id != NULL);

    wp_token_consume_hexadecimal_digits(tokenizer);
    switch (*tokenizer->it)
    {
        case 'p':
        {
            wp_token_advance_iter(tokenizer);
            return wp_token_scan_flt_exponent(
                tokenizer, id, W_TOKEN_ID_FLT_HEXADECIMAL
            );
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            *id = W_TOKEN_ID_FLT_HEXADECIMAL;
            return W_SUCCESS;
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                    "hexadecimal floating-point literal"
                )
            );
        }
    }
}